

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_zoh.c
# Opt level: O3

int zoh_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  int iVar1;
  void *pvVar2;
  float *pfVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  long lVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double local_50;
  undefined8 uStack_30;
  
  lVar8 = data->input_frames;
  if (0 < lVar8) {
    pvVar2 = psrc->private_data;
    if (pvVar2 == (void *)0x0) {
      return 5;
    }
    uVar9 = *(uint *)((long)pvVar2 + 4);
    if (*(int *)((long)pvVar2 + 8) != 0) {
      if (0 < (int)uVar9) {
        pfVar3 = data->data_in;
        uVar10 = 0;
        do {
          *(float *)((long)pvVar2 + uVar10 * 4 + 0x30) = pfVar3[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar9 != uVar10);
      }
      *(undefined4 *)((long)pvVar2 + 8) = 0;
    }
    lVar8 = lVar8 * (int)uVar9;
    *(long *)((long)pvVar2 + 0x10) = lVar8;
    lVar7 = (long)(int)uVar9 * data->output_frames;
    *(long *)((long)pvVar2 + 0x20) = lVar7;
    *(undefined8 *)((long)pvVar2 + 0x28) = 0;
    *(undefined8 *)((long)pvVar2 + 0x18) = 0;
    dVar11 = psrc->last_ratio;
    if (dVar11 < 0.00390625) {
      return 0x16;
    }
    if (256.0 < dVar11) {
      return 0x16;
    }
    dVar13 = psrc->last_position;
    local_50 = dVar11;
    if (dVar13 < 1.0) {
      lVar6 = 0;
      do {
        if ((lVar7 <= lVar6) || ((double)lVar8 <= (double)(int)uVar9 * dVar13 + 0.0)) break;
        if ((0 < lVar7) && (1e-20 < ABS(dVar11 - data->src_ratio))) {
          local_50 = ((data->src_ratio - dVar11) * (double)lVar6) / (double)lVar7 + dVar11;
        }
        if (0 < (int)uVar9) {
          pfVar3 = data->data_out;
          uVar10 = 0;
          do {
            pfVar3[lVar6 + uVar10] = *(float *)((long)pvVar2 + uVar10 * 4 + 0x30);
            uVar10 = uVar10 + 1;
          } while (uVar9 != uVar10);
          lVar6 = lVar6 + uVar10;
          *(long *)((long)pvVar2 + 0x28) = lVar6;
        }
        dVar13 = dVar13 + 1.0 / local_50;
      } while (dVar13 < 1.0);
    }
    lVar8 = lrint(dVar13);
    dVar11 = dVar13 - (double)lVar8;
    dVar11 = (double)(~-(ulong)(dVar11 < 0.0) & (ulong)dVar11 |
                     (ulong)(dVar11 + 1.0) & -(ulong)(dVar11 < 0.0));
    iVar1 = *(int *)((long)pvVar2 + 4);
    lVar8 = lrint(dVar13 - dVar11);
    lVar6 = lVar8 * iVar1 + *(long *)((long)pvVar2 + 0x18);
    *(long *)((long)pvVar2 + 0x18) = lVar6;
    lVar8 = *(long *)((long)pvVar2 + 0x20);
    lVar7 = *(long *)((long)pvVar2 + 0x28);
    if (lVar7 < lVar8) {
      uStack_30 = 0;
      do {
        uVar9 = *(uint *)((long)pvVar2 + 4);
        if ((double)*(long *)((long)pvVar2 + 0x10) < (double)(int)uVar9 * dVar11 + (double)lVar6)
        break;
        if (0 < lVar8) {
          dVar13 = psrc->last_ratio;
          if (1e-20 < ABS(dVar13 - data->src_ratio)) {
            local_50 = ((data->src_ratio - dVar13) * (double)lVar7) / (double)lVar8 + dVar13;
          }
        }
        if (0 < (int)uVar9) {
          pfVar3 = data->data_out;
          pfVar4 = data->data_in;
          lVar8 = -(ulong)uVar9;
          do {
            pfVar3[lVar7] = pfVar4[lVar6 + lVar8];
            lVar7 = lVar7 + 1;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0);
          *(long *)((long)pvVar2 + 0x28) = lVar7;
        }
        dVar13 = dVar11 + 1.0 / local_50;
        lVar8 = lrint(dVar13);
        dVar11 = dVar13 - (double)lVar8;
        auVar12._0_8_ = ~-(ulong)(dVar11 < 0.0) & (ulong)dVar11;
        auVar12._8_8_ = 0;
        auVar5._8_4_ = (int)uStack_30;
        auVar5._0_8_ = (ulong)(dVar11 + 1.0) & -(ulong)(dVar11 < 0.0);
        auVar5._12_4_ = (int)((ulong)uStack_30 >> 0x20);
        iVar1 = *(int *)((long)pvVar2 + 4);
        dVar11 = SUB168(auVar12 | auVar5,0);
        lVar8 = lrint(dVar13 - dVar11);
        uStack_30 = SUB168(auVar12 | auVar5,8);
        lVar6 = lVar8 * iVar1 + *(long *)((long)pvVar2 + 0x18);
        *(long *)((long)pvVar2 + 0x18) = lVar6;
        lVar8 = *(long *)((long)pvVar2 + 0x20);
        lVar7 = *(long *)((long)pvVar2 + 0x28);
      } while (lVar7 < lVar8);
    }
    lVar8 = *(long *)((long)pvVar2 + 0x10);
    if (lVar6 - lVar8 == 0 || lVar6 < lVar8) {
      uVar9 = *(uint *)((long)pvVar2 + 4);
    }
    else {
      uVar9 = *(uint *)((long)pvVar2 + 4);
      dVar11 = dVar11 + (double)((lVar6 - lVar8) / (long)(int)uVar9);
      *(long *)((long)pvVar2 + 0x18) = lVar8;
      lVar6 = lVar8;
    }
    psrc->last_position = dVar11;
    if ((0 < lVar6) && (0 < (int)uVar9)) {
      pfVar3 = data->data_in;
      uVar10 = 0;
      do {
        *(float *)((long)pvVar2 + uVar10 * 4 + 0x30) = pfVar3[(lVar6 - (ulong)uVar9) + uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    psrc->last_ratio = local_50;
    data->input_frames_used = lVar6 / (long)(int)uVar9;
    data->output_frames_gen = lVar7 / (long)(int)uVar9;
  }
  return 0;
}

Assistant:

static int
zoh_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	ZOH_DATA 	*priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (ZOH_DATA*) psrc->private_data ;

	if (priv->reset)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->reset = 0 ;
		} ;

	priv->in_count = data->input_frames * priv->channels ;
	priv->out_count = data->output_frames * priv->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = psrc->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + priv->channels * input_index >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = priv->last_value [ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += priv->channels * lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + priv->channels * input_index <= priv->in_count)
	{
		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = data->data_in [priv->in_used - priv->channels + ch] ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += priv->channels * lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / priv->channels ;
		priv->in_used = priv->in_count ;
		} ;

	psrc->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - priv->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / priv->channels ;
	data->output_frames_gen = priv->out_gen / priv->channels ;

	return SRC_ERR_NO_ERROR ;
}